

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

int __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorNoActiveQuery::init
          (TransformFeedbackOverflowQueryErrorNoActiveQuery *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  
  TransformFeedbackOverflowQueryBaseTest::init((TransformFeedbackOverflowQueryBaseTest *)this,ctx);
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x6e0))(1,&this->m_active_stream_overflow_query);
    this->m_active_query_stream_index = 2;
    iVar2 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x28))
                      (0x82ed,2,this->m_active_stream_overflow_query);
    return iVar2;
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryErrorBase::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (supportsTransformFeedback3())
		{
			gl.genQueries(1, &m_active_stream_overflow_query);
			m_active_query_stream_index = 2;
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_active_query_stream_index,
								 m_active_stream_overflow_query);
		}
	}